

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemTxResult
flatview_write(uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *buf,
              hwaddr len)

{
  ram_addr_t addr_00;
  uint uVar1;
  MemTxResult MVar2;
  MemoryRegion_conflict *mr;
  uc_struct_conflict15 *uc_00;
  uint64_t data;
  MemOp op;
  hwaddr *plen;
  hwaddr local_60;
  uint local_54;
  ram_addr_t local_50;
  FlatView *local_48;
  uc_struct_conflict15 *local_40;
  hwaddr l;
  
  plen = &l;
  local_48 = fv;
  local_40 = uc;
  l = len;
  mr = flatview_translate_tricore(uc,fv,addr,&local_50,plen,true,attrs);
  local_60 = l;
  local_54 = 0;
  while( true ) {
    addr_00 = local_50;
    if ((mr->ram == false) || (mr->readonly == true)) {
      uVar1 = memory_access_size(mr,(uint)local_60,local_50);
      local_60 = (hwaddr)(int)uVar1;
      data = 0;
      switch(uVar1) {
      case 1:
        data = (uint64_t)(byte)*buf;
        break;
      case 2:
        data = (uint64_t)(ushort)*buf;
        break;
      case 4:
        data = (uint64_t)(uint)*buf;
        break;
      case 8:
        data = *buf;
      }
      op = MO_ALIGN_4;
      if ((uVar1 != 0) && (op = MO_8, uVar1 != 0)) {
        for (; (uVar1 >> op & 1) == 0; op = op + MO_16) {
        }
      }
      uc_00 = local_40;
      MVar2 = memory_region_dispatch_write_tricore(local_40,mr,addr_00,data,op,attrs);
      local_54 = local_54 | MVar2;
    }
    else {
      uc_00 = (uc_struct_conflict15 *)
              qemu_ram_ptr_length((uc_struct_conflict15 *)local_48->root->uc,mr->ram_block,local_50,
                                  &local_60,SUB81(plen,0));
      memcpy(uc_00,buf,local_60);
    }
    len = len - local_60;
    if (len == 0) break;
    addr = addr + local_60;
    buf = (void *)((long)buf + local_60);
    plen = &local_60;
    local_60 = len;
    mr = flatview_translate_tricore(uc_00,local_48,addr,&local_50,plen,true,attrs);
  }
  return local_54;
}

Assistant:

static MemTxResult flatview_write(struct uc_struct *uc, FlatView *fv, hwaddr addr, MemTxAttrs attrs,
                                  const void *buf, hwaddr len)
{
    hwaddr l;
    hwaddr addr1;
    MemoryRegion *mr;
    MemTxResult result = MEMTX_OK;

    l = len;
    mr = flatview_translate(uc, fv, addr, &addr1, &l, true, attrs);
    result = flatview_write_continue(uc, fv, addr, attrs, buf, len,
                                     addr1, l, mr);

    return result;
}